

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O2

void __thiscall
wasm::ReconstructStringifyWalker::~ReconstructStringifyWalker(ReconstructStringifyWalker *this)

{
  IRBuilder::~IRBuilder(&this->outlinedBuilder);
  IRBuilder::~IRBuilder(&this->existingBuilder);
  std::_Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
  ~_Vector_base(&(this->sequences).
                 super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
               );
  StringifyWalker<wasm::ReconstructStringifyWalker>::~StringifyWalker
            (&this->super_StringifyWalker<wasm::ReconstructStringifyWalker>);
  return;
}

Assistant:

ReconstructStringifyWalker(Module* wasm, Function* func)
    : existingBuilder(*wasm), outlinedBuilder(*wasm), func(func) {
    this->setModule(wasm);
    ODBG(std::cerr << "\nexistingBuilder: " << &existingBuilder
                   << " outlinedBuilder: " << &outlinedBuilder << "\n");
  }